

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall xray_re::xr_swibuf::load(xr_swibuf *this,xr_reader *r)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ogf4_slide_window *poVar5;
  size_t n;
  xr_reader *r_local;
  xr_swibuf *this_local;
  
  xr_flexbuf::clear(&this->super_xr_flexbuf);
  xr_reader::r_cseq<unsigned_int>(r,4,this->m_reserved);
  uVar2 = xr_reader::r_u32(r);
  uVar3 = CONCAT44(0,uVar2);
  if (uVar3 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    poVar5 = (ogf4_slide_window *)operator_new__(uVar4);
    this->m_slide_windows = poVar5;
    xr_reader::r_cseq<xray_re::ogf4_slide_window,read_sw>(r,uVar3,this->m_slide_windows);
    return;
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x218,"void xray_re::xr_swibuf::load(xr_reader &)");
}

Assistant:

void xr_swibuf::load(xr_reader& r)
{
	xr_flexbuf::clear();
	r.r_cseq<uint32_t>(4, m_reserved);
	size_t n = r.r_u32();
	xr_assert(n > 0);
	m_slide_windows = new ogf4_slide_window[n];
	r.r_cseq(n, m_slide_windows, read_sw());
}